

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void finish(lda *ld)

{
  vector<index_feature,_std::allocator<index_feature>_> *in_stack_00000010;
  
  std::vector<index_feature,_std::allocator<index_feature>_>::~vector(in_stack_00000010);
  v_array<float>::delete_v((v_array<float> *)ld);
  v_array<float>::delete_v((v_array<float> *)ld);
  v_array<float>::delete_v((v_array<float> *)ld);
  v_array<example_*>::delete_v((v_array<example_*> *)ld);
  v_array<float>::delete_v((v_array<float> *)ld);
  v_array<int>::delete_v((v_array<int> *)ld);
  v_array<float>::delete_v((v_array<float> *)ld);
  v_array<float>::delete_v((v_array<float> *)ld);
  return;
}

Assistant:

void finish(lda &ld)
{
  ld.sorted_features.~vector<index_feature>();
  ld.Elogtheta.delete_v();
  ld.decay_levels.delete_v();
  ld.total_new.delete_v();
  ld.examples.delete_v();
  ld.total_lambda.delete_v();
  ld.doc_lengths.delete_v();
  ld.digammas.delete_v();
  ld.v.delete_v();
}